

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void * MemOSAlloc(sxu32 nBytes)

{
  sxu32 *pChunk;
  sxu32 *psStack_10;
  sxu32 nBytes_local;
  
  psStack_10 = (sxu32 *)SyOSHeapAlloc(nBytes + 4);
  if (psStack_10 == (sxu32 *)0x0) {
    psStack_10 = (sxu32 *)0x0;
  }
  else {
    *psStack_10 = nBytes;
    psStack_10 = psStack_10 + 1;
  }
  return psStack_10;
}

Assistant:

static void * MemOSAlloc(sxu32 nBytes)
{
	sxu32 *pChunk;
	pChunk = (sxu32 *)SyOSHeapAlloc(nBytes + sizeof(sxu32));
	if( pChunk == 0 ){
		return 0;
	}
	pChunk[0] = nBytes;
	return (void *)&pChunk[1];
}